

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  err_t code;
  char *pcVar2;
  cmd_main_i *pp_Var3;
  ulong uVar4;
  
  if ((argc < 2) || (iVar1 = strCmp(argv[1],"stamp"), iVar1 != 0)) {
    code = cmdStDo(0x2000001);
    if ((code != 0) || (code = cmdInit(), code != 0)) goto LAB_0010cdf4;
    if (argc < 2) {
      cmdUsage();
      return -1;
    }
  }
  else {
    code = cmdInit();
    if (code != 0) goto LAB_0010cdf4;
  }
  if (_count != 0) {
    pp_Var3 = &_cmds[0].fn;
    uVar4 = 0;
    do {
      iVar1 = strCmp(argv[1],((cmd_entry_t *)(pp_Var3 + -2))->name);
      if (iVar1 == 0) {
        iVar1 = (**pp_Var3)(argc + -1,argv + 1);
        return iVar1;
      }
      uVar4 = uVar4 + 1;
      pp_Var3 = pp_Var3 + 3;
    } while (uVar4 < _count);
  }
  code = 0x259;
LAB_0010cdf4:
  pcVar2 = errMsg(code);
  printf("bee2cmd: %s\n",pcVar2);
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{
	err_t code;
	size_t pos;
	// проверка штампа
	if ((argc < 2 || !strEq(argv[1], "stamp")) &&
		(code = cmdStDo(CMD_ST_BASH | CMD_ST_STAMP)) != ERR_OK)
	{
		printf("bee2cmd: %s\n", errMsg(code));
		return -1;
	}
	// старт
	code = cmdInit();
	if (code != ERR_OK)
	{
		printf("bee2cmd: %s\n", errMsg(code));
		return -1;
	}
	// справка
	if (argc < 2)
		return cmdUsage();
	// обработка команды
	for (pos = 0; pos < _count; ++pos)
		if (strEq(argv[1], _cmds[pos].name))
			return _cmds[pos].fn(argc - 1,  argv + 1);
	printf("bee2cmd: %s\n", errMsg(ERR_CMD_NOT_FOUND));
	return -1;
}